

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void vdbeMemClearExternAndSetNull(Mem *p)

{
  long in_RDI;
  Mem *in_stack_00000008;
  
  if ((*(ushort *)(in_RDI + 0x14) & 0x8000) != 0) {
    sqlite3VdbeMemFinalize(in_stack_00000008,(FuncDef *)p);
  }
  if ((*(ushort *)(in_RDI + 0x14) & 0x1000) != 0) {
    (**(code **)(in_RDI + 0x30))(*(undefined8 *)(in_RDI + 8));
  }
  *(undefined2 *)(in_RDI + 0x14) = 1;
  return;
}

Assistant:

static SQLITE_NOINLINE void vdbeMemClearExternAndSetNull(Mem *p){
  assert( p->db==0 || sqlite3_mutex_held(p->db->mutex) );
  assert( VdbeMemDynamic(p) );
  if( p->flags&MEM_Agg ){
    sqlite3VdbeMemFinalize(p, p->u.pDef);
    assert( (p->flags & MEM_Agg)==0 );
    testcase( p->flags & MEM_Dyn );
  }
  if( p->flags&MEM_Dyn ){
    assert( p->xDel!=SQLITE_DYNAMIC && p->xDel!=0 );
    p->xDel((void *)p->z);
  }
  p->flags = MEM_Null;
}